

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O0

void __thiscall SEIUnit::processBlurayOffsetMetadata(SEIUnit *this)

{
  byte bVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *ptr;
  SEIUnit *this_local;
  
  BitStreamReader::skipBits(&(this->super_NALUnit).bitReader,8);
  puVar3 = BitStream::getBuffer(&(this->super_NALUnit).bitReader.super_BitStream);
  iVar2 = BitStreamReader::getBitsCount(&(this->super_NALUnit).bitReader);
  this->metadataPtsOffset = ((int)puVar3 + iVar2 / 8) - (int)(this->super_NALUnit).m_nalBuffer;
  BitStreamReader::skipBits(&(this->super_NALUnit).bitReader,0x18);
  BitStreamReader::skipBits(&(this->super_NALUnit).bitReader,0x12);
  bVar1 = BitStreamReader::getBits<unsigned_char>(&(this->super_NALUnit).bitReader,6);
  this->number_of_offset_sequences = (uint)bVar1;
  return;
}

Assistant:

void SEIUnit::processBlurayOffsetMetadata()
{
    bitReader.skipBits(8);
    const uint8_t* ptr = bitReader.getBuffer() + bitReader.getBitsCount() / 8;
    metadataPtsOffset = static_cast<int>(ptr - m_nalBuffer);
    bitReader.skipBits(24);  // PTS[32..30], marker_bit, PTS[29..15]
    bitReader.skipBits(18);  // marker_bit, PTS[14..0], marker_bit, reserved_for_future_use bit
    number_of_offset_sequences = bitReader.getBits<uint8_t>(6);
}